

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkElement.cpp
# Opt level: O0

void __thiscall
iDynTree::LinkElement::childHasBeenParsed(LinkElement *this,shared_ptr<iDynTree::XMLElement> *child)

{
  bool bVar1;
  element_type *this_00;
  VisualInfo *__x;
  long in_RDI;
  shared_ptr<iDynTree::VisualElement> visualElement;
  vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>
  *visualContainer;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>
  *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  __shared_ptr local_78 [16];
  vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>
  local_68 [2];
  string local_38 [32];
  long local_18;
  
  local_18 = 0;
  std::__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a6c27);
  iDynTree::XMLElement::name_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_38);
  if (bVar1) {
    local_18 = in_RDI + 0xa8;
  }
  else {
    std::__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a6cb2);
    in_stack_ffffffffffffff50 = local_68;
    iDynTree::XMLElement::name_abi_cxx11_();
    in_stack_ffffffffffffff5f = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
    ;
    std::__cxx11::string::~string((string *)local_68);
    if ((in_stack_ffffffffffffff5f & 1) == 0) {
      return;
    }
    local_18 = in_RDI + 0xc0;
  }
  std::dynamic_pointer_cast<iDynTree::VisualElement,iDynTree::XMLElement>
            ((shared_ptr<iDynTree::XMLElement> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_78);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<iDynTree::VisualElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<iDynTree::VisualElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a6da8);
    __x = VisualElement::visualInfo(this_00);
    std::
    vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>
    ::push_back(in_stack_ffffffffffffff50,__x);
  }
  else {
    iDynTree::reportError
              ("LinkElement","childHasBeenParsed",
               "Expecting a VisualElement for visual/collision child. Got another element instead.")
    ;
  }
  std::shared_ptr<iDynTree::VisualElement>::~shared_ptr
            ((shared_ptr<iDynTree::VisualElement> *)0x1a6dda);
  return;
}

Assistant:

void LinkElement::childHasBeenParsed(std::shared_ptr<iDynTree::XMLElement> child)
    {
        std::vector<VisualElement::VisualInfo>* visualContainer = nullptr;
        if (child->name() == "visual") {
            visualContainer = &m_visuals;
        } else if (child->name() == "collision") {
            visualContainer = &m_collisions;
        } else {
            return;
        }
        std::shared_ptr<VisualElement> visualElement = std::dynamic_pointer_cast<VisualElement>(child);
        if (!visualElement) {
            reportError("LinkElement", "childHasBeenParsed", "Expecting a VisualElement for visual/collision child. Got another element instead.");
            return;
        }
        visualContainer->push_back(visualElement->visualInfo());
    }